

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderTarget.cpp
# Opt level: O0

void __thiscall sf::RenderTarget::RenderTarget(RenderTarget *this)

{
  View *in_RDI;
  
  NonCopyable::NonCopyable((NonCopyable *)in_RDI);
  in_RDI->m_center = (Vector2f)&PTR__RenderTarget_004937d8;
  View::View(in_RDI);
  View::View(in_RDI);
  in_RDI[2].m_inverseTransform.m_matrix[5] = 0.0;
  in_RDI[2].m_inverseTransform.m_matrix[6] = 0.0;
  in_RDI[2].m_inverseTransform.m_matrix[7] = 0.0;
  in_RDI[2].m_inverseTransform.m_matrix[8] = 0.0;
  in_RDI[2].m_inverseTransform.m_matrix[1] = 0.0;
  in_RDI[2].m_inverseTransform.m_matrix[2] = 0.0;
  in_RDI[2].m_inverseTransform.m_matrix[3] = 0.0;
  in_RDI[2].m_inverseTransform.m_matrix[4] = 0.0;
  in_RDI[2].m_transform.m_matrix[0xd] = 0.0;
  in_RDI[2].m_transform.m_matrix[0xe] = 0.0;
  *(undefined8 *)(in_RDI[2].m_transform.m_matrix + 0xf) = 0;
  in_RDI[2].m_transform.m_matrix[9] = 0.0;
  in_RDI[2].m_transform.m_matrix[10] = 0.0;
  in_RDI[2].m_transform.m_matrix[0xb] = 0.0;
  in_RDI[2].m_transform.m_matrix[0xc] = 0.0;
  in_RDI[2].m_transform.m_matrix[5] = 0.0;
  in_RDI[2].m_transform.m_matrix[6] = 0.0;
  in_RDI[2].m_transform.m_matrix[7] = 0.0;
  in_RDI[2].m_transform.m_matrix[8] = 0.0;
  in_RDI[2].m_transform.m_matrix[1] = 0.0;
  in_RDI[2].m_transform.m_matrix[2] = 0.0;
  in_RDI[2].m_transform.m_matrix[3] = 0.0;
  in_RDI[2].m_transform.m_matrix[4] = 0.0;
  in_RDI[2].m_viewport.top = 0.0;
  in_RDI[2].m_viewport.width = 0.0;
  *(undefined8 *)&in_RDI[2].m_viewport.height = 0;
  in_RDI[2].m_size.x = 0.0;
  in_RDI[2].m_size.y = 0.0;
  in_RDI[2].m_rotation = 0.0;
  in_RDI[2].m_viewport.left = 0.0;
  StatesCache::StatesCache((StatesCache *)in_RDI);
  in_RDI[2].m_inverseTransform.m_matrix[9] = 0.0;
  in_RDI[2].m_inverseTransform.m_matrix[10] = 0.0;
  *(undefined1 *)((long)&in_RDI[2].m_size.x + 1) = 0;
  return;
}

Assistant:

RenderTarget::RenderTarget() :
m_defaultView(),
m_view       (),
m_cache      (),
m_id         (0)
{
    m_cache.glStatesSet = false;
}